

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QWidget*,QPersistentModelIndex>::emplace_helper<QPersistentModelIndex_const&>
          (QHash<QWidget*,QPersistentModelIndex> *this,QWidget **key,QPersistentModelIndex *args)

{
  piter pVar1;
  Node<QWidget_*,_QPersistentModelIndex> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>>::findOrInsert<QWidget*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QWidget*,QPersistentModelIndex>> **)this,key);
  n = (Node<QWidget_*,_QPersistentModelIndex> *)
      ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
      (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
      [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QWidget*,QPersistentModelIndex>::createInPlace<QPersistentModelIndex_const&>
              (n,key,args);
  }
  else {
    QHashPrivate::Node<QWidget*,QPersistentModelIndex>::emplaceValue<QPersistentModelIndex_const&>
              ((Node<QWidget*,QPersistentModelIndex> *)n,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }